

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Swap
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  undefined8 uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  void **ppvVar8;
  long lVar9;
  RepeatedField<unsigned_long> temp;
  RepeatedField<unsigned_long> local_38;
  
  if (this != other) {
    ppvVar8 = (void **)((long)this->arena_or_elements_ + -8);
    if (this->total_size_ == 0) {
      ppvVar8 = &this->arena_or_elements_;
    }
    ppvVar7 = (void **)((long)other->arena_or_elements_ + -8);
    if (other->total_size_ == 0) {
      ppvVar7 = &other->arena_or_elements_;
    }
    if (*ppvVar8 == *ppvVar7) {
      iVar5 = this->current_size_;
      iVar6 = this->total_size_;
      pvVar2 = this->arena_or_elements_;
      iVar4 = other->total_size_;
      pvVar3 = other->arena_or_elements_;
      this->current_size_ = other->current_size_;
      this->total_size_ = iVar4;
      this->arena_or_elements_ = pvVar3;
      other->current_size_ = iVar5;
      other->total_size_ = iVar6;
      other->arena_or_elements_ = pvVar2;
    }
    else {
      RepeatedField(&local_38,(Arena *)*ppvVar7);
      if (this->current_size_ != 0) {
        lVar9 = (long)local_38.current_size_;
        Reserve(&local_38,this->current_size_ + local_38.current_size_);
        local_38.current_size_ = local_38.current_size_ + this->current_size_;
        memcpy((void *)(lVar9 * 8 + (long)local_38.arena_or_elements_),this->arena_or_elements_,
               (long)this->current_size_ << 3);
      }
      this->current_size_ = 0;
      if (other->current_size_ != 0) {
        Reserve(this,other->current_size_);
        this->current_size_ = this->current_size_ + other->current_size_;
        memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 3);
      }
      if (&local_38 != other) {
        uVar1._0_4_ = other->current_size_;
        uVar1._4_4_ = other->total_size_;
        pvVar2 = other->arena_or_elements_;
        other->current_size_ = local_38.current_size_;
        other->total_size_ = local_38.total_size_;
        other->arena_or_elements_ = local_38.arena_or_elements_;
        local_38._0_8_ = uVar1;
        local_38.arena_or_elements_ = pvVar2;
      }
      ~RepeatedField(&local_38);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}